

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void waiter(EventCount *eventCount)

{
  Key KVar1;
  ostream *poVar2;
  EventCount *in_RDI;
  EventCount *unaff_retaddr;
  Key key;
  int i;
  int local_c;
  
  for (local_c = 0; local_c < 100; local_c = local_c + 1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Preparing wait: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_c);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    KVar1 = EventCount::prepareWait(unaff_retaddr);
    EventCount::wait(in_RDI,(void *)(ulong)KVar1.epoch_);
    poVar2 = std::operator<<((ostream *)&std::cout,"Got notification: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_c);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void waiter(EventCount *eventCount) {
    for (int i = 0; i < 100; i++) {
        std::cout << "Preparing wait: " << i << std::endl;
        auto key = eventCount->prepareWait();
        eventCount->wait(key);
        std::cout << "Got notification: " << i << std::endl;
    }
}